

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_function.hpp
# Opt level: O3

void __thiscall
duckdb::MultiFileFunction<duckdb::CSVMultiFileInfo>::~MultiFileFunction
          (MultiFileFunction<duckdb::CSVMultiFileInfo> *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  (this->super_TableFunction).super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function
  ._vptr_Function = (_func_int **)&PTR__TableFunction_02432fe0;
  this_00 = (this->super_TableFunction).function_info.internal.
            super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction((SimpleNamedParameterFunction *)this);
  operator_delete(this);
  return;
}

Assistant:

explicit MultiFileFunction(string name_p)
	    : TableFunction(std::move(name_p), {LogicalType::VARCHAR}, MultiFileScan, MultiFileBind, MultiFileInitGlobal,
	                    MultiFileInitLocal) {
		cardinality = MultiFileCardinality;
		table_scan_progress = MultiFileProgress;
		get_partition_data = MultiFileGetPartitionData;
		get_bind_info = MultiFileGetBindInfo;
		projection_pushdown = true;
		pushdown_complex_filter = MultiFileComplexFilterPushdown;
		get_partition_info = MultiFileGetPartitionInfo;
		get_virtual_columns = MultiFileGetVirtualColumns;
		dynamic_to_string = MultiFileDynamicToString;
		MultiFileReader::AddParameters(*this);
	}